

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtk.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkCreateFromGias(char *pName,Vec_Ptr_t *vGias,Gia_Man_t *pMulti)

{
  uint uVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  Abc_Obj_t *pAVar8;
  int iVar9;
  
  pGVar3 = pMulti;
  if (pMulti == (Gia_Man_t *)0x0) {
    pGVar3 = (Gia_Man_t *)Vec_PtrEntry(vGias,0);
  }
  pNtk = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
  pcVar4 = Extra_UtilStrsav(pName);
  pNtk->pName = pcVar4;
  for (iVar9 = 0; iVar9 < pGVar3->vCis->nSize; iVar9 = iVar9 + 1) {
    Abc_NtkCreatePi(pNtk);
  }
  if (pMulti == (Gia_Man_t *)0x0) {
    for (iVar9 = 0; iVar9 < vGias->nSize; iVar9 = iVar9 + 1) {
      pGVar3 = (Gia_Man_t *)Vec_PtrEntry(vGias,iVar9);
      if (pGVar3->vCos->nSize != 1) {
        __assert_fail("Gia_ManCoNum(pGia) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcNtk.c"
                      ,0x8f4,"Abc_Ntk_t *Abc_NtkCreateFromGias(char *, Vec_Ptr_t *, Gia_Man_t *)");
      }
      Gia_ManCleanValue(pGVar3);
      for (iVar2 = 0; iVar2 < pGVar3->vCis->nSize; iVar2 = iVar2 + 1) {
        pGVar5 = Gia_ManCi(pGVar3,iVar2);
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        pAVar6 = Abc_NtkCi(pNtk,iVar2);
        pGVar5->Value = pAVar6->Id;
      }
      for (iVar2 = 0; iVar2 < pGVar3->nObjs; iVar2 = iVar2 + 1) {
        pGVar5 = Gia_ManObj(pGVar3,iVar2);
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        uVar7 = *(ulong *)pGVar5 & 0x1fffffff;
        if (uVar7 != 0x1fffffff && -1 < (int)*(ulong *)pGVar5) {
          pAVar6 = Abc_NtkObj(pNtk,pGVar5[-uVar7].Value);
          pAVar8 = Abc_NtkObj(pNtk,pGVar5[-(ulong)(*(uint *)&pGVar5->field_0x4 & 0x1fffffff)].Value)
          ;
          pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                              (Abc_Obj_t *)
                              ((ulong)((uint)(*(ulong *)pGVar5 >> 0x1d) & 1) ^ (ulong)pAVar6),
                              (Abc_Obj_t *)
                              ((ulong)((uint)(*(ulong *)pGVar5 >> 0x3d) & 1) ^ (ulong)pAVar8));
          pGVar5->Value = pAVar6->Id;
        }
      }
      pGVar5 = Gia_ManCo(pGVar3,0);
      iVar2 = Gia_ObjFaninId0p(pGVar3,pGVar5);
      if (iVar2 == 0) {
        pAVar6 = Abc_AigConst1(pNtk);
        pAVar6 = (Abc_Obj_t *)((ulong)pAVar6 ^ 1);
      }
      else {
        pAVar6 = Abc_NtkObj(pNtk,pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value);
      }
      uVar1 = *(uint *)pGVar5;
      pAVar8 = Abc_NtkCreatePo(pNtk);
      Abc_ObjAddFanin(pAVar8,(Abc_Obj_t *)((ulong)(uVar1 >> 0x1d & 1) ^ (ulong)pAVar6));
    }
  }
  else {
    Gia_ManCleanValue(pGVar3);
    for (iVar9 = 0; iVar9 < pGVar3->vCis->nSize; iVar9 = iVar9 + 1) {
      pGVar5 = Gia_ManCi(pGVar3,iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      pAVar6 = Abc_NtkCi(pNtk,iVar9);
      pGVar5->Value = pAVar6->Id;
    }
    for (iVar9 = 0; iVar9 < pGVar3->nObjs; iVar9 = iVar9 + 1) {
      pGVar5 = Gia_ManObj(pGVar3,iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      uVar7 = *(ulong *)pGVar5 & 0x1fffffff;
      if (uVar7 != 0x1fffffff && -1 < (int)*(ulong *)pGVar5) {
        pAVar6 = Abc_NtkObj(pNtk,pGVar5[-uVar7].Value);
        pAVar8 = Abc_NtkObj(pNtk,pGVar5[-(ulong)(*(uint *)&pGVar5->field_0x4 & 0x1fffffff)].Value);
        pAVar6 = Abc_AigAnd((Abc_Aig_t *)pNtk->pManFunc,
                            (Abc_Obj_t *)
                            ((ulong)((uint)(*(ulong *)pGVar5 >> 0x1d) & 1) ^ (ulong)pAVar6),
                            (Abc_Obj_t *)
                            ((ulong)((uint)(*(ulong *)pGVar5 >> 0x3d) & 1) ^ (ulong)pAVar8));
        pGVar5->Value = pAVar6->Id;
      }
    }
    for (iVar9 = 0; iVar9 < pGVar3->vCos->nSize; iVar9 = iVar9 + 1) {
      pGVar5 = Gia_ManCo(pGVar3,iVar9);
      if (pGVar5 == (Gia_Obj_t *)0x0) break;
      iVar2 = Gia_ObjFaninId0p(pGVar3,pGVar5);
      if (iVar2 == 0) {
        pAVar6 = Abc_AigConst1(pNtk);
        pAVar6 = (Abc_Obj_t *)((ulong)pAVar6 ^ 1);
      }
      else {
        pAVar6 = Abc_NtkObj(pNtk,pGVar5[-(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff)].Value);
      }
      uVar1 = *(uint *)pGVar5;
      pAVar8 = Abc_NtkCreatePo(pNtk);
      Abc_ObjAddFanin(pAVar8,(Abc_Obj_t *)((ulong)(uVar1 >> 0x1d & 1) ^ (ulong)pAVar6));
    }
  }
  Abc_NtkAddDummyPiNames(pNtk);
  Abc_NtkAddDummyPoNames(pNtk);
  return pNtk;
}

Assistant:

Abc_Ntk_t * Abc_NtkCreateFromGias( char * pName, Vec_Ptr_t * vGias, Gia_Man_t * pMulti )
{
    Gia_Man_t * pGia = pMulti ? pMulti : (Gia_Man_t *)Vec_PtrEntry(vGias, 0);
    Abc_Ntk_t * pNtk = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
    Abc_Obj_t * pAbcObj, * pAbcObjPo;
    Gia_Obj_t * pObj; int i, k;
    pNtk->pName = Extra_UtilStrsav( pName );
    for ( k = 0; k < Gia_ManCiNum(pGia); k++ )
        Abc_NtkCreatePi( pNtk );
    if ( pMulti )
    {
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        Gia_ManForEachCo( pGia, pObj, k )
        {
            //pObj = Gia_ManCo(pGia, 0);
            if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
                pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
            else
                pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
            pAbcObjPo = Abc_NtkCreatePo( pNtk );
            Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
        }
    }
    else
    {
    Vec_PtrForEachEntry( Gia_Man_t *, vGias, pGia, i )
    {
        assert( Gia_ManCoNum(pGia) == 1 );
        Gia_ManCleanValue(pGia);
        Gia_ManForEachCi( pGia, pObj, k )
            pObj->Value = Abc_ObjId( Abc_NtkCi(pNtk, k) );
        Gia_ManForEachAnd( pGia, pObj, k )
        {
            Abc_Obj_t * pAbcObj0 = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
            Abc_Obj_t * pAbcObj1 = Abc_NtkObj( pNtk, Gia_ObjFanin1(pObj)->Value );
            pAbcObj0 = Abc_ObjNotCond( pAbcObj0, Gia_ObjFaninC0(pObj) );
            pAbcObj1 = Abc_ObjNotCond( pAbcObj1, Gia_ObjFaninC1(pObj) );
            pAbcObj  = Abc_AigAnd( (Abc_Aig_t *)pNtk->pManFunc, pAbcObj0, pAbcObj1 );
            pObj->Value = Abc_ObjId( pAbcObj ); 
        }
        pObj = Gia_ManCo(pGia, 0);
        if ( Gia_ObjFaninId0p(pGia, pObj) == 0 )
            pAbcObj = Abc_ObjNot( Abc_AigConst1(pNtk) );
        else
            pAbcObj = Abc_NtkObj( pNtk, Gia_ObjFanin0(pObj)->Value );
        pAbcObj = Abc_ObjNotCond( pAbcObj, Gia_ObjFaninC0(pObj) );
        pAbcObjPo = Abc_NtkCreatePo( pNtk );
        Abc_ObjAddFanin( pAbcObjPo, pAbcObj );
    }
    }
    Abc_NtkAddDummyPiNames( pNtk );
    Abc_NtkAddDummyPoNames( pNtk );
    return pNtk;
}